

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildbench_device.cpp
# Opt level: O2

void embree::convertSubdivMesh(ISPCSubdivMesh *mesh,RTCScene scene_out,RTCBuildQuality quality)

{
  size_t i;
  undefined8 uVar1;
  ulong uVar2;
  size_t t;
  
  uVar1 = rtcNewGeometry(g_device,8);
  rtcSetGeometryTimeStepCount(uVar1,mesh->numTimeSteps);
  rtcSetGeometryBuildQuality(uVar1,quality);
  for (uVar2 = 0; uVar2 < mesh->numEdges; uVar2 = uVar2 + 1) {
    mesh->subdivlevel[uVar2] = 16.0;
  }
  for (uVar2 = 0; uVar2 < mesh->numTimeSteps; uVar2 = uVar2 + 1) {
    rtcSetSharedGeometryBuffer
              (uVar1,1,uVar2 & 0xffffffff,0x9003,mesh->positions[uVar2],0,0x10,mesh->numVertices);
  }
  rtcSetSharedGeometryBuffer(uVar1,0x11,0,0x9001,mesh->subdivlevel,0,4,mesh->numEdges);
  rtcSetSharedGeometryBuffer(uVar1,0,0,0x5001,mesh->position_indices,0,4,mesh->numEdges);
  rtcSetSharedGeometryBuffer(uVar1,0x10,0,0x5001,mesh->verticesPerFace,0,4,mesh->numFaces);
  rtcSetSharedGeometryBuffer(uVar1,0x16,0,0x5001,mesh->holes,0,4,mesh->numHoles);
  rtcSetSharedGeometryBuffer(uVar1,0x12,0,0x5002,mesh->edge_creases,0,8,mesh->numEdgeCreases);
  rtcSetSharedGeometryBuffer(uVar1,0x13,0,0x9001,mesh->edge_crease_weights,0,4,mesh->numEdgeCreases)
  ;
  rtcSetSharedGeometryBuffer(uVar1,0x14,0,0x5001,mesh->vertex_creases,0,4,mesh->numVertexCreases);
  uVar2 = (ulong)mesh->numVertexCreases;
  rtcSetSharedGeometryBuffer(uVar1,0x15,0,0x9001,mesh->vertex_crease_weights,0,4);
  rtcSetGeometrySubdivisionMode(uVar1,0,mesh->position_subdiv_mode,uVar2);
  rtcCommitGeometry(uVar1);
  rtcAttachGeometry(scene_out,uVar1);
  rtcReleaseGeometry(uVar1);
  return;
}

Assistant:

void convertSubdivMesh(ISPCSubdivMesh* mesh, RTCScene scene_out, RTCBuildQuality quality)
  {
    RTCGeometry geom = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_SUBDIVISION);
    rtcSetGeometryTimeStepCount(geom, mesh->numTimeSteps);
    rtcSetGeometryBuildQuality(geom, quality);
    for (size_t i=0; i<mesh->numEdges; i++) mesh->subdivlevel[i] = 16.0f;
    for (size_t t=0; t<mesh->numTimeSteps; t++) {
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, (unsigned int)t, RTC_FORMAT_FLOAT3, mesh->positions[t], 0, sizeof(Vec3fa), mesh->numVertices);
    }
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_LEVEL, 0, RTC_FORMAT_FLOAT, mesh->subdivlevel,      0, sizeof(float),        mesh->numEdges);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT,  mesh->position_indices, 0, sizeof(unsigned int), mesh->numEdges);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_FACE,  0, RTC_FORMAT_UINT,  mesh->verticesPerFace,  0, sizeof(unsigned int), mesh->numFaces);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_HOLE,  0, RTC_FORMAT_UINT,  mesh->holes,            0, sizeof(unsigned int), mesh->numHoles);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_EDGE_CREASE_INDEX,    0, RTC_FORMAT_UINT2, mesh->edge_creases,          0, 2*sizeof(unsigned int), mesh->numEdgeCreases);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_EDGE_CREASE_WEIGHT,   0, RTC_FORMAT_FLOAT, mesh->edge_crease_weights,   0, sizeof(float),          mesh->numEdgeCreases);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_CREASE_INDEX,  0, RTC_FORMAT_UINT,  mesh->vertex_creases,        0, sizeof(unsigned int),   mesh->numVertexCreases);
    rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_CREASE_WEIGHT, 0, RTC_FORMAT_FLOAT, mesh->vertex_crease_weights, 0, sizeof(float),          mesh->numVertexCreases);
    rtcSetGeometrySubdivisionMode(geom, 0, mesh->position_subdiv_mode);
    rtcCommitGeometry(geom);
    rtcAttachGeometry(scene_out,geom);
    rtcReleaseGeometry(geom);
  }